

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

ParseNodeUni * __thiscall
Parser::ParseDestructuredObjectLiteral<true>
          (Parser *this,tokens declarationType,bool isDecl,bool topLevel)

{
  Scanner_t *this_00;
  code *pcVar1;
  bool bVar2;
  charcount_t ichMin;
  charcount_t ichLim;
  undefined4 *puVar3;
  ParseNodePtr pnodeMemberList;
  ParseNodeObjLit *pPVar4;
  tokens declarationType_00;
  
  if ((this->m_token).tk != tkLCurly) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x33e8,"(m_token.tk == tkLCurly)","m_token.tk == tkLCurly");
    if (!bVar2) goto LAB_00e8c1f2;
    *puVar3 = 0;
  }
  this_00 = &this->m_scan;
  ichMin = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(this_00);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(this_00);
  declarationType_00 = tkLCurly;
  if (isDecl) {
    declarationType_00 = declarationType;
  }
  pnodeMemberList = ParseMemberList<true>(this,(LPCOLESTR)0x0,(uint32 *)0x0,declarationType_00);
  ichLim = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(this_00);
  pPVar4 = CreateObjectPatternNode(this,pnodeMemberList,ichMin,ichLim,false);
  if ((this->m_token).tk != tkRCurly) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x33f6,"(m_token.tk == tkRCurly)","m_token.tk == tkRCurly");
    if (!bVar2) {
LAB_00e8c1f2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return &pPVar4->super_ParseNodeUni;
}

Assistant:

ParseNodeUni * Parser::ParseDestructuredObjectLiteral(tokens declarationType, bool isDecl, bool topLevel/* = true*/)
{
    Assert(m_token.tk == tkLCurly);
    charcount_t ichMin = this->GetScanner()->IchMinTok();
    this->GetScanner()->Scan();

    if (!isDecl)
    {
        declarationType = tkLCurly;
    }
    ParseNodePtr pnodeMemberList = ParseMemberList<buildAST>(nullptr/*pNameHint*/, nullptr/*pHintLength*/, declarationType);

    charcount_t ichLim = this->GetScanner()->IchLimTok();

    ParseNodeObjLit * objectPatternNode = buildAST ? CreateObjectPatternNode(pnodeMemberList, ichMin, ichLim) : nullptr;

    Assert(m_token.tk == tkRCurly);
    return objectPatternNode;
}